

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::
GenerateConditionMaybeWithProbability_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,uint32_t mask,
          optional<float> probability,bool use_cached_has_bits,optional<int> has_array_index)

{
  bool bVar1;
  LogMessage *pLVar2;
  int *args;
  float *args_1;
  undefined4 in_register_00000014;
  undefined7 in_register_00000081;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)654848>
  local_e0;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355>
  local_d0;
  string local_c0;
  byte local_99;
  LogMessage local_98;
  Voidify local_85 [13];
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355> local_78;
  string local_68;
  undefined1 local_48 [8];
  string condition;
  bool use_cached_has_bits_local;
  _Optional_payload_base<int> _Stack_20;
  uint32_t mask_local;
  optional<int> has_array_index_local;
  optional<float> probability_local;
  
  has_array_index_local.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._4_4_ = in_register_00000014;
  has_array_index_local.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_payload._M_value = mask;
  _Stack_20._1_7_ = in_register_00000081;
  _Stack_20._M_payload._M_value._0_1_ = use_cached_has_bits;
  condition.field_2._12_4_ = SUB84(this,0);
  condition.field_2._M_local_buf[0xb] =
       probability.super__Optional_base<float,_true,_true>._M_payload.
       super__Optional_payload_base<float>._M_payload._0_1_ & 1;
  std::__cxx11::string::string((string *)local_48);
  if ((condition.field_2._M_local_buf[0xb] & 1U) == 0) {
    bVar1 = std::optional<int>::has_value((optional<int> *)&_Stack_20);
    local_99 = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                 ,0x83,"has_array_index.has_value()");
      local_99 = 1;
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
      absl::lts_20250127::log_internal::Voidify::operator&&(local_85,pLVar2);
    }
    if ((local_99 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_98);
    }
    absl::lts_20250127::str_format_internal::
    FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355>
    ::FormatSpecTemplate(&local_d0,"(this_._impl_._has_bits_[%d] & 0x%08xu) != 0");
    args = std::optional<int>::operator*((optional<int> *)&_Stack_20);
    absl::lts_20250127::StrFormat<int,_unsigned_int>
              (&local_c0,&local_d0,args,(uint *)(condition.field_2._M_local_buf + 0xc));
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    absl::lts_20250127::str_format_internal::
    FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355>::FormatSpecTemplate
              (&local_78,"(cached_has_bits & 0x%08xu) != 0");
    absl::lts_20250127::StrFormat<unsigned_int>
              (&local_68,&local_78,(uint *)(condition.field_2._M_local_buf + 0xc));
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  bVar1 = std::optional<float>::has_value((optional<float> *)&has_array_index_local);
  if (bVar1) {
    absl::lts_20250127::str_format_internal::
    FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)654848>
    ::FormatSpecTemplate(&local_e0,"PROTOBUF_EXPECT_TRUE_WITH_PROBABILITY(%s, %.3f)");
    args_1 = std::optional<float>::operator*((optional<float> *)&has_array_index_local);
    absl::lts_20250127::
    StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
              (__return_storage_ptr__,&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,args_1)
    ;
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateConditionMaybeWithProbability(
    uint32_t mask, absl::optional<float> probability, bool use_cached_has_bits,
    absl::optional<int> has_array_index) {
  std::string condition;
  if (use_cached_has_bits) {
    condition = absl::StrFormat("(cached_has_bits & 0x%08xu) != 0", mask);
  } else {
    // We only use has_array_index when use_cached_has_bits is false, make sure
    // we pas a valid index when we need it.
    ABSL_DCHECK(has_array_index.has_value());
    condition = absl::StrFormat("(this_._impl_._has_bits_[%d] & 0x%08xu) != 0",
                                *has_array_index, mask);
  }
  if (probability.has_value()) {
    return absl::StrFormat("PROTOBUF_EXPECT_TRUE_WITH_PROBABILITY(%s, %.3f)",
                           condition, *probability);
  }
  return condition;
}